

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O3

uint argo::utf8::utf8_length(uint8_t c)

{
  uint uVar1;
  uint uVar2;
  undefined7 in_register_00000039;
  
  uVar1 = 1;
  if ((char)c < '\0') {
    uVar2 = (uint)CONCAT71(in_register_00000039,c);
    uVar1 = 2;
    if (((uVar2 & 0xffffffe0) != 0xc0) && (uVar1 = 3, (uVar2 & 0xfffffff0) != 0xe0)) {
      return (uint)((uVar2 & 0xfffffff8) == 0xf0) << 2;
    }
  }
  return uVar1;
}

Assistant:

unsigned int utf8::utf8_length(uint8_t c)
{
    if ((c & 0x80) == 0)
    {
        return 1;
    }
    else if ((c & 0xe0) == 0xc0)
    {
        return 2;
    }
    else if ((c & 0xf0) == 0xe0)
    {
        return 3;
    }
    else if ((c & 0xf8) == 0xf0)
    {
        return 4;
    }
    else
    {
       return 0;
    }
}